

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keybdnu.c
# Opt level: O0

void al_clear_keyboard_state(ALLEGRO_DISPLAY *display)

{
  _Bool _Var1;
  long in_RDI;
  ALLEGRO_EVENT event;
  int keycode;
  ALLEGRO_KEYBOARD_STATE ks;
  ALLEGRO_EVENT_SOURCE *es;
  ALLEGRO_EVENT_SOURCE *in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffffa4;
  uint local_3c;
  ALLEGRO_KEYBOARD_STATE local_38;
  ALLEGRO_EVENT_SOURCE *local_10;
  
  if (in_RDI != 0) {
    local_10 = al_get_keyboard_event_source();
    al_get_keyboard_state((ALLEGRO_KEYBOARD_STATE *)0x179692);
    _al_event_source_lock(in_stack_ffffffffffffff80);
    _Var1 = _al_event_source_needs_to_generate_event(in_stack_ffffffffffffff80);
    if (_Var1) {
      for (local_3c = 1; (int)local_3c < 0xe3; local_3c = local_3c + 1) {
        _Var1 = al_key_down(&local_38,local_3c);
        if (_Var1) {
          al_get_time();
          _al_event_source_emit_event
                    ((ALLEGRO_EVENT_SOURCE *)((ulong)in_stack_ffffffffffffffa4 << 0x20),
                     (ALLEGRO_EVENT *)(ulong)local_3c);
        }
      }
    }
    _al_event_source_unlock(in_stack_ffffffffffffff80);
  }
  (*new_keyboard_driver->clear_keyboard_state)();
  return;
}

Assistant:

void al_clear_keyboard_state(ALLEGRO_DISPLAY *display)
{
   ASSERT(new_keyboard_driver);

   if (display) {
      ALLEGRO_EVENT_SOURCE *es = al_get_keyboard_event_source();
      ALLEGRO_KEYBOARD_STATE ks; al_get_keyboard_state(&ks);
      _al_event_source_lock(es);
      if (_al_event_source_needs_to_generate_event(es)) {
         int keycode;
         for (keycode = ALLEGRO_KEY_A; keycode < ALLEGRO_KEY_MAX; keycode++) {
            if (al_key_down(&ks, keycode)) {
               ALLEGRO_EVENT event;
               event.keyboard.type = ALLEGRO_EVENT_KEY_UP;
               event.keyboard.timestamp = al_get_time();
               event.keyboard.display = display;
               event.keyboard.keycode = keycode;
               event.keyboard.unichar = 0;
               event.keyboard.modifiers = 0;
               _al_event_source_emit_event(es, &event);
            }
         }
      }
      _al_event_source_unlock(es);
   }

   new_keyboard_driver->clear_keyboard_state();
}